

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O1

void preprocess_unsigned(aec_stream *strm)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  internal_state *piVar4;
  uint32_t *puVar5;
  uint32_t *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  piVar4 = strm->state;
  puVar5 = piVar4->data_raw;
  puVar6 = piVar4->data_pp;
  uVar1 = piVar4->xmax;
  uVar8 = strm->block_size;
  uVar2 = strm->rsi;
  piVar4->ref = 1;
  piVar4->ref_sample = *puVar5;
  *puVar6 = 0;
  uVar8 = uVar8 * uVar2 - 1;
  if (uVar8 != 0) {
    uVar9 = 0;
    do {
      uVar2 = puVar5[uVar9];
      uVar3 = puVar5[uVar9 + 1];
      if (uVar3 < uVar2) {
        if (uVar1 - uVar2 < uVar2 - uVar3) {
          uVar7 = uVar1 - uVar3;
        }
        else {
          uVar7 = (uVar2 - uVar3) * 2 - 1;
        }
      }
      else {
        uVar7 = (uVar3 - uVar2) * 2;
        if (uVar2 < uVar3 - uVar2) {
          uVar7 = uVar3;
        }
      }
      puVar6[uVar9 + 1] = uVar7;
      uVar9 = uVar9 + 1;
    } while (uVar8 != uVar9);
  }
  piVar4->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
  return;
}

Assistant:

static void preprocess_unsigned(struct aec_stream *strm)
{
    /**
       Preprocess RSI of unsigned samples.

       Combining preprocessing and converting to uint32_t in one loop
       is slower due to the data dependance on x_i-1.
    */

    uint32_t D;
    struct internal_state *state = strm->state;
    const uint32_t *restrict x = state->data_raw;
    uint32_t *restrict d = state->data_pp;
    uint32_t xmax = state->xmax;
    uint32_t rsi = strm->rsi * strm->block_size - 1;
    size_t i;

    state->ref = 1;
    state->ref_sample = x[0];
    d[0] = 0;
    for (i = 0; i < rsi; i++) {
        if (x[i + 1] >= x[i]) {
            D = x[i + 1] - x[i];
            if (D <= x[i])
                d[i + 1] = 2 * D;
            else
                d[i + 1] = x[i + 1];
        } else {
            D = x[i] - x[i + 1];
            if (D <= xmax - x[i])
                d[i + 1] = 2 * D - 1;
            else
                d[i + 1] = xmax - x[i + 1];
        }
    }
    state->uncomp_len = (strm->block_size - 1) * strm->bits_per_sample;
}